

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O3

QSizeF __thiscall QGridLayoutItem::effectiveMaxSize(QGridLayoutItem *this,QSizeF *constraint)

{
  uint uVar1;
  uint uVar2;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  qreal qVar3;
  qreal in_XMM1_Qa;
  qreal qVar4;
  QSizeF QVar5;
  qreal local_38;
  qreal qStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = constraint->wd;
  qStack_30 = constraint->ht;
  uVar1 = (*this->_vptr_QGridLayoutItem[2])(this,2);
  uVar2 = (*this->_vptr_QGridLayoutItem[2])(this,1);
  if ((uVar1 & uVar2 & 1) == 0) {
    (*this->_vptr_QGridLayoutItem[3])(this,1,constraint);
    if ((uVar1 & 1) == 0) {
      qStack_30 = in_XMM1_Qa;
    }
    if ((uVar2 & 1) == 0) {
      local_38 = extraout_XMM0_Qa;
    }
  }
  if ((local_38 < 0.0) ||
     (qVar4 = qStack_30, in_XMM1_Qa = qStack_30, qVar3 = local_38, qStack_30 < 0.0)) {
    (*this->_vptr_QGridLayoutItem[3])(this,2,&local_38);
    qVar3 = (qreal)(~-(ulong)(local_38 == -1.0) & (ulong)local_38 |
                   extraout_XMM0_Qa_00 & -(ulong)(local_38 == -1.0));
    qVar4 = qStack_30;
    if ((qStack_30 == -1.0) && (!NAN(qStack_30))) {
      qVar4 = in_XMM1_Qa;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar5.ht = qVar4;
    QVar5.wd = qVar3;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QSizeF QGridLayoutItem::effectiveMaxSize(const QSizeF &constraint) const
{
    QSizeF size = constraint;
    bool vGrow = (sizePolicy(Qt::Vertical) & QLayoutPolicy::GrowFlag) == QLayoutPolicy::GrowFlag;
    bool hGrow = (sizePolicy(Qt::Horizontal) & QLayoutPolicy::GrowFlag) == QLayoutPolicy::GrowFlag;
    if (!vGrow || !hGrow) {
        QSizeF pref = sizeHint(Qt::PreferredSize, constraint);
        if (!vGrow)
            size.setHeight(pref.height());
        if (!hGrow)
            size.setWidth(pref.width());
    }

    if (!size.isValid()) {
        QSizeF maxSize = sizeHint(Qt::MaximumSize, size);
        if (size.width() == -1)
            size.setWidth(maxSize.width());
        if (size.height() == -1)
            size.setHeight(maxSize.height());
    }
    return size;
}